

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-printers.h
# Opt level: O0

void testing::internal::PrintTo<int,phmap::priv::NonStandardLayout>
               (pair<int,_phmap::priv::NonStandardLayout> *value,ostream *os)

{
  ostream *os_local;
  pair<int,_phmap::priv::NonStandardLayout> *value_local;
  
  std::operator<<(os,'(');
  UniversalPrinter<int>::Print(&value->first,os);
  std::operator<<(os,", ");
  UniversalPrinter<phmap::priv::NonStandardLayout>::Print(&value->second,os);
  std::operator<<(os,')');
  return;
}

Assistant:

void PrintTo(const ::std::pair<T1, T2>& value, ::std::ostream* os) {
  *os << '(';
  // We cannot use UniversalPrint(value.first, os) here, as T1 may be
  // a reference type.  The same for printing value.second.
  UniversalPrinter<T1>::Print(value.first, os);
  *os << ", ";
  UniversalPrinter<T2>::Print(value.second, os);
  *os << ')';
}